

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O3

ztlex_t * ztlex_from_string(ztlex_mallocfn_t *mallocfn,ztlex_freefn_t *freefn,char *string)

{
  ztlex_t *pzVar1;
  size_t sVar2;
  
  pzVar1 = (ztlex_t *)(*mallocfn)(0x360);
  if (pzVar1 != (ztlex_t *)0x0) {
    pzVar1->file = (FILE *)0x0;
    pzVar1->ungottenptr = (char *)0x0;
    pzVar1->string = string;
    sVar2 = strlen(string);
    pzVar1->length = sVar2;
    pzVar1->index = 0;
    pzVar1->line = 1;
    pzVar1->column = 1;
    pzVar1->prevcolumn = -1;
    pzVar1->getC = ztlex_sgetc;
    pzVar1->ungetC = ztlex_sungetc;
    pzVar1->freefn = freefn;
  }
  return pzVar1;
}

Assistant:

ztlex_t *ztlex_from_string(ztlex_mallocfn_t *mallocfn,
                           ztlex_freefn_t   *freefn,
                           const char       *string)
{
  ztlex_t *lex = NULL;

  lex = mallocfn(sizeof(*lex));
  if (lex == NULL)
    return NULL;

  lex->file        = NULL;
  lex->ungottenptr = NULL;

  lex->string      = string; /* FIXME: Copy string */
  lex->length      = strlen(string);
  lex->index       = 0;

  lex->line        = 1;
  lex->column      = 1;
  lex->prevcolumn  = -1;

  lex->getC        = ztlex_sgetc;
  lex->ungetC      = ztlex_sungetc;

  lex->freefn      = freefn;

  return lex;
}